

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

path * create_out_folder(path *__return_storage_ptr__,string *st)

{
  bool bVar1;
  Error *this;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)st);
  bVar1 = boost::filesystem::exists(__return_storage_ptr__);
  if (!bVar1) {
    bVar1 = boost::filesystem::create_directory(__return_storage_ptr__);
    if (!bVar1) {
      this = (Error *)__cxa_allocate_exception(0x3f0);
      Error::Error(this,"Could not create output dir %s",(st->_M_dataplus)._M_p);
      __cxa_throw(this,&Error::typeinfo,std::exception::~exception);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

path create_out_folder(std::string st) {
  path p(st);
  if (!exists(p) && !create_directory(p)) {
    throw Error("Could not create output dir %s", &st[0]);
  }
  return p;
}